

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags.cc
# Opt level: O0

CommandLineFlag * __thiscall
google::anon_unknown_1::FlagRegistry::SplitArgumentLocked
          (FlagRegistry *this,char *arg,string *key,char **v,string *error_message)

{
  int iVar1;
  undefined8 uVar2;
  char *pcVar3;
  string local_b0 [32];
  string local_90 [32];
  string local_70 [32];
  CommandLineFlag *local_50;
  CommandLineFlag *flag;
  char *value;
  char *flag_name;
  string *error_message_local;
  char **v_local;
  string *key_local;
  char *arg_local;
  FlagRegistry *this_local;
  
  flag_name = (char *)error_message;
  error_message_local = (string *)v;
  v_local = (char **)key;
  key_local = (string *)arg;
  arg_local = (char *)this;
  flag = (CommandLineFlag *)strchr(arg,0x3d);
  if (flag == (CommandLineFlag *)0x0) {
    std::__cxx11::string::assign((char *)v_local);
    *(undefined8 *)error_message_local = 0;
  }
  else {
    std::__cxx11::string::assign((char *)v_local,(ulong)key_local);
    flag = (CommandLineFlag *)((long)&flag->name_ + 1);
    *(CommandLineFlag **)error_message_local = flag;
  }
  value = (char *)std::__cxx11::string::c_str();
  local_50 = FindFlagLocked(this,value);
  if (local_50 == (CommandLineFlag *)0x0) {
    if ((*value != 'n') || (value[1] != 'o')) {
      uVar2 = std::__cxx11::string::c_str();
      StringPrintf_abi_cxx11_
                ((char *)local_70,"%sunknown command line flag \'%s\'\n","ERROR: ",uVar2);
      std::__cxx11::string::operator=((string *)flag_name,local_70);
      std::__cxx11::string::~string(local_70);
      return (CommandLineFlag *)0x0;
    }
    local_50 = FindFlagLocked(this,value + 2);
    if (local_50 == (CommandLineFlag *)0x0) {
      uVar2 = std::__cxx11::string::c_str();
      StringPrintf_abi_cxx11_
                ((char *)local_90,"%sunknown command line flag \'%s\'\n","ERROR: ",uVar2);
      std::__cxx11::string::operator=((string *)flag_name,local_90);
      std::__cxx11::string::~string(local_90);
      return (CommandLineFlag *)0x0;
    }
    pcVar3 = CommandLineFlag::type_name(local_50);
    iVar1 = strcmp(pcVar3,"bool");
    if (iVar1 != 0) {
      uVar2 = std::__cxx11::string::c_str();
      pcVar3 = CommandLineFlag::type_name(local_50);
      StringPrintf_abi_cxx11_
                ((char *)local_b0,"%sboolean value (%s) specified for %s command line flag\n",
                 "ERROR: ",uVar2,pcVar3);
      std::__cxx11::string::operator=((string *)flag_name,local_b0);
      std::__cxx11::string::~string(local_b0);
      return (CommandLineFlag *)0x0;
    }
    std::__cxx11::string::assign((char *)v_local);
    *(char **)error_message_local = "0";
  }
  if (*(long *)error_message_local == 0) {
    pcVar3 = CommandLineFlag::type_name(local_50);
    iVar1 = strcmp(pcVar3,"bool");
    if (iVar1 == 0) {
      *(char **)error_message_local = "1";
    }
  }
  return local_50;
}

Assistant:

CommandLineFlag* FlagRegistry::SplitArgumentLocked(const char* arg,
                                                   string* key,
                                                   const char** v,
                                                   string* error_message) {
  // Find the flag object for this option
  const char* flag_name;
  const char* value = strchr(arg, '=');
  if (value == NULL) {
    key->assign(arg);
    *v = NULL;
  } else {
    // Strip out the "=value" portion from arg
    key->assign(arg, value-arg);
    *v = ++value;    // advance past the '='
  }
  flag_name = key->c_str();

  CommandLineFlag* flag = FindFlagLocked(flag_name);

  if (flag == NULL) {
    // If we can't find the flag-name, then we should return an error.
    // The one exception is if 1) the flag-name is 'nox', 2) there
    // exists a flag named 'x', and 3) 'x' is a boolean flag.
    // In that case, we want to return flag 'x'.
    if (!(flag_name[0] == 'n' && flag_name[1] == 'o')) {
      // flag-name is not 'nox', so we're not in the exception case.
      *error_message = StringPrintf("%sunknown command line flag '%s'\n",
                                    kError, key->c_str());
      return NULL;
    }
    flag = FindFlagLocked(flag_name+2);
    if (flag == NULL) {
      // No flag named 'x' exists, so we're not in the exception case.
      *error_message = StringPrintf("%sunknown command line flag '%s'\n",
                                    kError, key->c_str());
      return NULL;
    }
    if (strcmp(flag->type_name(), "bool") != 0) {
      // 'x' exists but is not boolean, so we're not in the exception case.
      *error_message = StringPrintf(
          "%sboolean value (%s) specified for %s command line flag\n",
          kError, key->c_str(), flag->type_name());
      return NULL;
    }
    // We're in the exception case!
    // Make up a fake value to replace the "no" we stripped out
    key->assign(flag_name+2);   // the name without the "no"
    *v = "0";
  }

  // Assign a value if this is a boolean flag
  if (*v == NULL && strcmp(flag->type_name(), "bool") == 0) {
    *v = "1";    // the --nox case was already handled, so this is the --x case
  }

  return flag;
}